

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::GatherGLSLCompile::Run(GatherGLSLCompile *this)

{
  bool bVar1;
  GLuint GVar2;
  bool *compile_error;
  char *local_50 [4];
  char *local_30 [4];
  
  (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xb])(local_30,this);
  (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc])(local_50,this);
  GVar2 = TGBase::CreateProgram(&this->super_TGBase,local_30[0],local_50[0]);
  this->program = GVar2;
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)local_30);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->program);
  bVar1 = TGBase::CheckProgram(&this->super_TGBase,this->program,compile_error);
  return (ulong)bVar1 - 1;
}

Assistant:

virtual long Run()
	{
		program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str());
		glLinkProgram(program);
		if (!CheckProgram(program))
			return ERROR;
		return NO_ERROR;
	}